

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCapsuleShape.cpp
# Opt level: O3

btVector3 __thiscall
btCapsuleShape::localGetSupportingVertexWithoutMargin(btCapsuleShape *this,btVector3 *vec0)

{
  int iVar1;
  float fVar2;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar3;
  float fVar4;
  float fVar5;
  btVector3 bVar6;
  btScalar local_78 [2];
  undefined8 uStack_70;
  undefined1 local_68 [16];
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  undefined1 local_38 [8];
  float fStack_30;
  float fStack_2c;
  undefined1 local_28 [16];
  float local_18;
  float fStack_14;
  undefined8 uStack_10;
  
  local_58 = (float)*(undefined8 *)vec0->m_floats;
  fStack_54 = (float)((ulong)*(undefined8 *)vec0->m_floats >> 0x20);
  fVar4 = vec0->m_floats[2];
  fVar2 = fVar4 * fVar4 + local_58 * local_58 + fStack_54 * fStack_54;
  if (0.0001 <= fVar2) {
    fStack_4c = 1.0 / SQRT(fVar2);
    fVar4 = fVar4 * fStack_4c;
    local_58 = local_58 * fStack_4c;
    fStack_54 = fStack_54 * fStack_4c;
    fStack_50 = fStack_4c * 0.0;
    fStack_4c = fStack_4c * 0.0;
  }
  else {
    local_58 = 1.0;
    fStack_54 = 0.0;
    fStack_50 = 0.0;
    fStack_4c = 0.0;
    fVar4 = 0.0;
  }
  iVar1 = *(int *)&(this->super_btConvexInternalShape).field_0x44;
  fVar2 = (this->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats[(iVar1 + 2) % 3];
  _local_38 = ZEXT416((uint)fVar2);
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  uStack_70 = 0;
  local_78[iVar1] = (this->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats[iVar1];
  fVar2 = fVar4 * fVar2;
  local_48 = ZEXT416((uint)fVar2);
  local_68 = ZEXT416((uint)((float)uStack_70 + fVar2));
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])(this);
  fVar2 = (float)local_38._0_4_ * local_58;
  local_38._4_4_ = (float)local_38._0_4_ * fStack_54;
  fStack_30 = (float)local_38._0_4_ * fStack_50;
  fStack_2c = (float)local_38._0_4_ * fStack_4c;
  local_38._0_4_ = fVar2;
  local_18 = (local_78[0] + fVar2) - extraout_XMM0_Da * local_58;
  fStack_14 = (local_78[1] + (float)local_38._4_4_) - extraout_XMM0_Da * fStack_54;
  fVar2 = (float)local_68._0_4_ - fVar4 * extraout_XMM0_Da;
  fVar3 = fVar4 * fVar2 + local_58 * local_18 + fStack_54 * fStack_14;
  if (-1e+18 < fVar3) {
    uStack_10 = CONCAT44((fStack_2c + 0.0) - extraout_XMM0_Da * fStack_4c,
                         (fStack_30 + 0.0) - extraout_XMM0_Da * fStack_50);
  }
  else {
    fVar2 = 0.0;
    local_18 = 0.0;
    fStack_14 = 0.0;
    uStack_10 = 0;
  }
  local_28 = ZEXT416((uint)fVar2);
  if (fVar3 <= -1e+18) {
    fVar3 = -1e+18;
  }
  local_68._0_4_ = fVar3;
  local_78[0] = 0.0;
  local_78[1] = 0.0;
  uStack_70 = 0;
  iVar1 = *(int *)&(this->super_btConvexInternalShape).field_0x44;
  local_78[iVar1] = -(this->super_btConvexInternalShape).m_implicitShapeDimensions.m_floats[iVar1];
  local_48._0_4_ = (float)local_48._0_4_ + (float)uStack_70;
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])(this);
  fVar2 = ((float)local_38._0_4_ + local_78[0]) - extraout_XMM0_Da_00 * local_58;
  fVar3 = ((float)local_38._4_4_ + local_78[1]) - extraout_XMM0_Da_00 * fStack_54;
  fVar5 = (float)local_48._0_4_ - fVar4 * extraout_XMM0_Da_00;
  if ((float)local_68._0_4_ < fVar4 * fVar5 + local_58 * fVar2 + fStack_54 * fVar3) {
    local_28._4_4_ = 0;
  }
  else {
    fVar2 = local_18;
    fVar3 = fStack_14;
    fVar5 = (float)local_28._0_4_;
  }
  bVar6.m_floats[1] = fVar3;
  bVar6.m_floats[0] = fVar2;
  bVar6.m_floats[3] = (btScalar)local_28._4_4_;
  bVar6.m_floats[2] = fVar5;
  return (btVector3)bVar6.m_floats;
}

Assistant:

btVector3	btCapsuleShape::localGetSupportingVertexWithoutMargin(const btVector3& vec0)const
{

	btVector3 supVec(0,0,0);

	btScalar maxDot(btScalar(-BT_LARGE_FLOAT));

	btVector3 vec = vec0;
	btScalar lenSqr = vec.length2();
	if (lenSqr < btScalar(0.0001))
	{
		vec.setValue(1,0,0);
	} else
	{
		btScalar rlen = btScalar(1.) / btSqrt(lenSqr );
		vec *= rlen;
	}

	btVector3 vtx;
	btScalar newDot;
	
	btScalar radius = getRadius();


	{
		btVector3 pos(0,0,0);
		pos[getUpAxis()] = getHalfHeight();

		vtx = pos +vec*(radius) - vec * getMargin();
		newDot = vec.dot(vtx);
		if (newDot > maxDot)
		{
			maxDot = newDot;
			supVec = vtx;
		}
	}
	{
		btVector3 pos(0,0,0);
		pos[getUpAxis()] = -getHalfHeight();

		vtx = pos +vec*(radius) - vec * getMargin();
		newDot = vec.dot(vtx);
		if (newDot > maxDot)
		{
			maxDot = newDot;
			supVec = vtx;
		}
	}

	return supVec;

}